

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::copy_val(char *dst,char *src,int round)

{
  int iVar1;
  char *ext;
  char *pcVar2;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  size_t dst_prec;
  size_t src_prec;
  undefined4 in_stack_ffffffffffffffe8;
  
  ext = (char *)get_prec((char *)0x2be40c);
  pcVar2 = (char *)get_prec((char *)0x2be41b);
  if (ext < pcVar2) {
    memcpy(in_RDI + 2,(void *)(in_RSI + 2),((ulong)(ext + 1) >> 1) + 3);
    memset(in_RDI + ((ulong)(ext + 1) >> 1) + 5,0,
           ((ulong)(pcVar2 + 1) >> 1) - ((ulong)(ext + 1) >> 1));
    set_dig(in_RDI,(size_t)ext,0);
  }
  else {
    memcpy(in_RDI + 2,(void *)(in_RSI + 2),((ulong)(pcVar2 + 1) >> 1) + 3);
    if ((in_EDX != 0) &&
       (iVar1 = get_round_dir((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                              (int)((ulong)ext >> 0x20)), iVar1 != 0)) {
      round_up_abs(ext);
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::copy_val(char *dst, const char *src, int round)
{
    size_t src_prec = get_prec(src);
    size_t dst_prec = get_prec(dst);

    /* check to see if we're growing or shrinking */
    if (dst_prec > src_prec)
    {
        /* 
         *   it's growing - copy the entire old mantissa, plus the flags,
         *   sign, and exponent 
         */
        memcpy(dst + VMBN_EXP, src + VMBN_EXP,
               (VMBN_MANT - VMBN_EXP) + (src_prec + 1)/2);

        /* clear the balance of the mantissa */
        memset(dst + VMBN_MANT + (src_prec + 1)/2,
               0, (dst_prec + 1)/2 - (src_prec + 1)/2);

        /* 
         *   clear the digit just after the last digit we copied - we might
         *   have missed this with the memset, since it only deals with
         *   even-numbered pairs of digits
         */
        set_dig(dst, src_prec, 0);
    }
    else
    {
        /* it's shrinking - truncate the mantissa to the new length */
        memcpy(dst + VMBN_EXP, src + VMBN_EXP,
               (VMBN_MANT - VMBN_EXP) + (dst_prec + 1)/2);

        /* check for rounding */
        if (round && get_round_dir(src, dst_prec))
            round_up_abs(dst);
    }
}